

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O0

string * __thiscall
cmStateDirectory::ConvertToRelPathIfNotContained
          (string *__return_storage_ptr__,cmStateDirectory *this,string *param_1,string *remote_path
          )

{
  bool bVar1;
  string *remote_path_local;
  string *local_path_local;
  cmStateDirectory *this_local;
  
  bVar1 = ContainsBoth(this,param_1,remote_path);
  if (bVar1) {
    cmSystemTools::ForceToRelativePath(__return_storage_ptr__,param_1,remote_path);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)remote_path);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmStateDirectory::ConvertToRelPathIfNotContained(
  std::string const& local_path, std::string const& remote_path) const
{
  if (!this->ContainsBoth(local_path, remote_path)) {
    return remote_path;
  }
  return cmSystemTools::ForceToRelativePath(local_path, remote_path);
}